

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O0

int __thiscall DIS::IntercomControlPdu::getMarshalledSize(IntercomControlPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined1 local_30 [8];
  IntercomCommunicationsParameters listElement;
  unsigned_long_long idx;
  int marshalSize;
  IntercomControlPdu *this_local;
  
  iVar2 = RadioCommunicationsFamilyPdu::getMarshalledSize(&this->super_RadioCommunicationsFamilyPdu)
  ;
  iVar3 = EntityID::getMarshalledSize(&this->_sourceEntityID);
  iVar4 = EntityID::getMarshalledSize(&this->_masterEntityID);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + 0xd;
  listElement._recordType = 0;
  listElement._recordLength = 0;
  listElement._recordSpecificField = 0;
  while( true ) {
    uVar1 = listElement._8_8_;
    sVar5 = std::
            vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
            ::size(&this->_intercomParameters);
    if (sVar5 <= (ulong)uVar1) break;
    pvVar6 = std::
             vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
             ::operator[](&this->_intercomParameters,listElement._8_8_);
    IntercomCommunicationsParameters::IntercomCommunicationsParameters
              ((IntercomCommunicationsParameters *)local_30,pvVar6);
    iVar2 = IntercomCommunicationsParameters::getMarshalledSize
                      ((IntercomCommunicationsParameters *)local_30);
    idx._4_4_ = idx._4_4_ + iVar2;
    IntercomCommunicationsParameters::~IntercomCommunicationsParameters
              ((IntercomCommunicationsParameters *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int IntercomControlPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = RadioCommunicationsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 1;  // _controlType
   marshalSize = marshalSize + 1;  // _communicationsChannelType
   marshalSize = marshalSize + _sourceEntityID.getMarshalledSize();  // _sourceEntityID
   marshalSize = marshalSize + 1;  // _sourceCommunicationsDeviceID
   marshalSize = marshalSize + 1;  // _sourceLineID
   marshalSize = marshalSize + 1;  // _transmitPriority
   marshalSize = marshalSize + 1;  // _transmitLineState
   marshalSize = marshalSize + 1;  // _command
   marshalSize = marshalSize + _masterEntityID.getMarshalledSize();  // _masterEntityID
   marshalSize = marshalSize + 2;  // _masterCommunicationsDeviceID
   marshalSize = marshalSize + 4;  // _intercomParametersLength

   for(unsigned long long idx=0; idx < _intercomParameters.size(); idx++)
   {
        IntercomCommunicationsParameters listElement = _intercomParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}